

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_enc.c
# Opt level: O1

int VP8EncWrite(VP8Encoder *enc)

{
  VP8EncProba *probas;
  int *percent_store;
  undefined2 uVar1;
  WebPPicture *pic;
  size_t sVar2;
  WebPAuxStats *pWVar3;
  WebPPicture *pWVar4;
  size_t sVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  uint32_t uVar11;
  ulong uVar12;
  undefined1 *puVar13;
  ulong uVar14;
  WebPPicture *pWVar15;
  ulong uVar16;
  VP8BitWriter *bw;
  VP8BitWriter *pVVar17;
  WebPEncodingError error;
  size_t *psVar18;
  long lVar19;
  bool bVar20;
  uint8_t pad_byte [1];
  uint8_t buf [21];
  uint8_t local_71;
  ulong local_70;
  uint8_t local_68;
  undefined1 uStack_67;
  undefined1 uStack_66;
  undefined1 uStack_65;
  undefined1 uStack_64;
  undefined1 uStack_63;
  undefined1 uStack_62;
  undefined1 uStack_61;
  undefined2 uStack_60;
  undefined2 uStack_5e;
  undefined1 uStack_5c;
  undefined1 uStack_5b;
  undefined1 uStack_5a;
  undefined1 uStack_59;
  undefined2 local_58;
  ulong local_50;
  int local_48;
  int local_44;
  ulong local_40;
  uint8_t *local_38;
  
  pic = enc->pic_;
  pVVar17 = &enc->bw_;
  local_44 = (int)(0x13 / (long)enc->num_parts_);
  local_48 = enc->percent_;
  uVar8 = (enc->bw_).run_;
  sVar2 = (enc->bw_).pos_;
  iVar7 = enc->mb_w_ * enc->mb_h_ * 7;
  iVar6 = iVar7 + 7;
  if (-1 < iVar7) {
    iVar6 = iVar7;
  }
  iVar7 = (enc->bw_).nb_bits_;
  iVar6 = VP8BitWriterInit(pVVar17,(long)(iVar6 >> 3));
  if (iVar6 == 0) {
    pWVar15 = enc->pic_;
LAB_0013827e:
    iVar7 = WebPEncodingSetError(pWVar15,VP8_ENC_ERROR_OUT_OF_MEMORY);
    if (iVar7 == 0) {
      return 0;
    }
  }
  else {
    local_70 = uVar8 + sVar2;
    local_50 = (long)iVar7;
    VP8PutBitUniform(pVVar17,0);
    VP8PutBitUniform(pVVar17,0);
    probas = &enc->proba_;
    iVar7 = VP8PutBitUniform(pVVar17,(uint)(1 < (enc->segment_hdr_).num_segments_));
    if (iVar7 != 0) {
      VP8PutBitUniform(pVVar17,(enc->segment_hdr_).update_map_);
      iVar7 = VP8PutBitUniform(pVVar17,1);
      if (iVar7 != 0) {
        VP8PutBitUniform(pVVar17,1);
        lVar10 = 0;
        do {
          VP8PutSignedBits(pVVar17,*(int *)((long)&enc->dqm_[0].quant_ + lVar10),7);
          lVar10 = lVar10 + 0x2e8;
        } while (lVar10 != 0xba0);
        lVar10 = 0;
        do {
          VP8PutSignedBits(pVVar17,*(int *)((long)&enc->dqm_[0].fstrength_ + lVar10),6);
          lVar10 = lVar10 + 0x2e8;
        } while (lVar10 != 0xba0);
      }
      if ((enc->segment_hdr_).update_map_ != 0) {
        lVar10 = 0;
        do {
          iVar7 = VP8PutBitUniform(pVVar17,(uint)(probas->segments_[lVar10] != 0xff));
          if (iVar7 != 0) {
            VP8PutBits(pVVar17,(uint)probas->segments_[lVar10],8);
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != 3);
      }
    }
    iVar7 = (enc->filter_hdr_).i4x4_lf_delta_;
    VP8PutBitUniform(pVVar17,(enc->filter_hdr_).simple_);
    VP8PutBits(pVVar17,(enc->filter_hdr_).level_,6);
    uVar11 = 3;
    VP8PutBits(pVVar17,(enc->filter_hdr_).sharpness_,3);
    iVar7 = VP8PutBitUniform(pVVar17,(uint)(iVar7 != 0));
    if ((iVar7 != 0) &&
       (iVar7 = VP8PutBitUniform(pVVar17,(uint)((enc->filter_hdr_).i4x4_lf_delta_ != 0)), iVar7 != 0
       )) {
      VP8PutBits(pVVar17,0,4);
      VP8PutSignedBits(pVVar17,(enc->filter_hdr_).i4x4_lf_delta_,6);
      VP8PutBits(pVVar17,0,3);
    }
    iVar7 = enc->num_parts_;
    if (iVar7 == 4) {
      uVar11 = 2;
    }
    else if (iVar7 != 8) {
      uVar11 = (uint32_t)(iVar7 == 2);
    }
    VP8PutBits(pVVar17,uVar11,2);
    VP8PutBits(pVVar17,enc->base_quant_,7);
    VP8PutSignedBits(pVVar17,enc->dq_y1_dc_,4);
    VP8PutSignedBits(pVVar17,enc->dq_y2_dc_,4);
    VP8PutSignedBits(pVVar17,enc->dq_y2_ac_,4);
    VP8PutSignedBits(pVVar17,enc->dq_uv_dc_,4);
    VP8PutSignedBits(pVVar17,enc->dq_uv_ac_,4);
    VP8PutBitUniform(pVVar17,0);
    VP8WriteProbas(pVVar17,probas);
    lVar10 = (long)(enc->bw_).nb_bits_;
    sVar2 = (enc->bw_).pos_;
    uVar8 = (enc->bw_).run_;
    VP8CodeIntraModes(enc);
    VP8BitWriterFinish(pVVar17);
    pWVar15 = enc->pic_;
    pWVar3 = pWVar15->stats;
    if (pWVar3 != (WebPAuxStats *)0x0) {
      sVar5 = (enc->bw_).pos_;
      iVar7 = (enc->bw_).run_;
      iVar6 = (enc->bw_).nb_bits_;
      lVar19 = sVar2 + uVar8;
      pWVar3->header_bytes[0] = (int)(lVar10 + lVar19 * 8 + ~(local_50 + local_70 * 8) + 8 >> 3);
      pWVar3->header_bytes[1] =
           (int)(((long)iVar6 - (lVar10 + lVar19 * 8 + 8)) + 0xfU >> 3) + (int)sVar5 + iVar7;
      pWVar3->alpha_data_size = enc->alpha_data_size_;
    }
    if ((enc->bw_).error_ != 0) goto LAB_0013827e;
  }
  uVar12 = (enc->bw_).pos_;
  iVar7 = enc->num_parts_;
  uVar9 = (ulong)(iVar7 * 3 + -3);
  lVar10 = uVar9 + uVar12 + 10;
  if (0 < (long)iVar7) {
    uVar9 = 0;
    do {
      lVar10 = lVar10 + *(long *)((long)&enc->parts_[0].pos_ + uVar9);
      uVar9 = uVar9 + 0x30;
    } while ((long)iVar7 * 0x30 != uVar9);
  }
  uVar14 = (ulong)((uint)lVar10 & 1);
  bVar20 = enc->has_alpha_ == 0;
  lVar19 = uVar14 + 0x1e;
  if (bVar20) {
    lVar19 = uVar14 + 0xc;
  }
  uVar16 = lVar19 + lVar10;
  if (!bVar20) {
    uVar8 = enc->alpha_data_size_ & 1;
    uVar9 = (ulong)uVar8;
    uVar16 = uVar16 + (enc->alpha_data_size_ + uVar8 + 8);
  }
  if (0xfffffffe < uVar16) {
    iVar7 = WebPEncodingSetError(pic,VP8_ENC_ERROR_FILE_TOO_BIG);
    return iVar7;
  }
  pWVar15 = enc->pic_;
  local_38 = (enc->bw_).buf_;
  local_68 = 'R';
  uStack_67 = 0x49;
  uStack_66 = 0x46;
  uStack_65 = 0x46;
  uStack_60 = 0x4557;
  uStack_5e = 0x5042;
  uStack_64 = (undefined1)uVar16;
  uStack_63 = (undefined1)(uVar16 >> 8);
  uStack_62 = (undefined1)(uVar16 >> 0x10);
  uStack_61 = (undefined1)(uVar16 >> 0x18);
  local_70 = uVar14;
  local_50 = uVar16;
  iVar7 = (*pWVar15->writer)(&local_68,0xc,pWVar15);
  bVar20 = iVar7 == 0;
  if (bVar20) {
LAB_00138515:
    error = (uint)bVar20 << 3;
LAB_0013851c:
    iVar7 = WebPEncodingSetError(pWVar15,error);
    if (iVar7 != 0) goto LAB_00138531;
  }
  else {
    if (enc->has_alpha_ != 0) {
      pWVar4 = enc->pic_;
      local_68 = 'V';
      uStack_67 = 0x50;
      uStack_66 = 0x38;
      uStack_65 = 0x58;
      uStack_64 = 10;
      uStack_63 = 0;
      uStack_62 = 0;
      uStack_61 = 0;
      uStack_60 = 0x10;
      uStack_5e = 0;
      iVar7 = pWVar4->width + -1;
      uStack_5c = (undefined1)iVar7;
      uStack_5b = (undefined1)((uint)iVar7 >> 8);
      uStack_5a = (undefined1)((uint)iVar7 >> 0x10);
      iVar7 = pWVar4->height + -1;
      uStack_59 = (undefined1)iVar7;
      local_58 = (undefined2)((uint)iVar7 >> 8);
      iVar7 = (*pWVar4->writer)(&local_68,0x12,pWVar4);
      bVar20 = iVar7 == 0;
      if (bVar20) goto LAB_00138515;
    }
    if (enc->has_alpha_ != 0) {
      pWVar4 = enc->pic_;
      local_68 = 'A';
      uStack_67 = 0x4c;
      uStack_66 = 0x50;
      uStack_65 = 0x48;
      uVar11 = enc->alpha_data_size_;
      uStack_64 = (undefined1)uVar11;
      uStack_63 = (undefined1)(uVar11 >> 8);
      uStack_62 = (undefined1)(uVar11 >> 0x10);
      uStack_61 = (undefined1)(uVar11 >> 0x18);
      local_40 = uVar12;
      iVar7 = (*pWVar4->writer)(&local_68,8,pWVar4);
      error = VP8_ENC_ERROR_BAD_WRITE;
      if ((iVar7 == 0) ||
         (iVar7 = (*pWVar4->writer)(enc->alpha_data_,(ulong)enc->alpha_data_size_,pWVar4),
         iVar7 == 0)) {
LAB_0013845c:
        bVar20 = false;
      }
      else {
        if ((enc->alpha_data_size_ & 1) != 0) {
          local_71 = '\0';
          iVar7 = (*pWVar4->writer)(&local_71,1,pWVar4);
          if (iVar7 == 0) goto LAB_0013845c;
        }
        error = VP8_ENC_OK;
        bVar20 = true;
      }
      uVar12 = local_40;
      if (bVar20) goto LAB_0013846b;
      goto LAB_0013851c;
    }
LAB_0013846b:
    lVar10 = lVar10 + local_70;
    local_68 = 'V';
    uStack_67 = 0x50;
    uStack_66 = 0x38;
    uStack_65 = 0x20;
    uStack_64 = (undefined1)lVar10;
    uStack_63 = (undefined1)((ulong)lVar10 >> 8);
    uStack_62 = (undefined1)((ulong)lVar10 >> 0x10);
    uStack_61 = (undefined1)((ulong)lVar10 >> 0x18);
    iVar7 = (*pWVar15->writer)(&local_68,8,pWVar15);
    bVar20 = iVar7 == 0;
    if (bVar20) goto LAB_00138515;
    error = VP8_ENC_ERROR_PARTITION0_OVERFLOW;
    if (uVar12 < 0x80000) {
      uVar8 = (int)uVar12 << 5 | enc->profile_ * 2;
      uVar9 = (ulong)uVar8 | 0x10;
      local_68 = (uint8_t)uVar9;
      uStack_67 = (undefined1)(uVar8 >> 8);
      uStack_66 = (undefined1)(uVar8 >> 0x10);
      uStack_65 = 0x9d;
      uStack_64 = 1;
      uStack_63 = 0x2a;
      uVar1 = (undefined2)pWVar15->width;
      uStack_62 = (undefined1)uVar1;
      uStack_61 = (undefined1)((ushort)uVar1 >> 8);
      uStack_60 = (undefined2)pWVar15->height;
      iVar7 = (*pWVar15->writer)(&local_68,10,pWVar15);
      error = (uint)(iVar7 == 0) << 3;
    }
    if (error != VP8_ENC_OK) goto LAB_0013851c;
LAB_00138531:
    iVar7 = (*pic->writer)(local_38,uVar12,pic);
    if (iVar7 != 0) {
      lVar10 = 0;
      if (1 < enc->num_parts_) {
        puVar13 = &uStack_66;
        psVar18 = &enc->parts_[0].pos_;
        lVar10 = 0;
        do {
          uVar12 = *psVar18;
          if (uVar12 < 0x1000000) {
            puVar13[-2] = (char)uVar12;
            puVar13[-1] = (char)(uVar12 >> 8);
            *puVar13 = (char)(uVar12 >> 0x10);
          }
          else {
            uVar8 = WebPEncodingSetError(pic,VP8_ENC_ERROR_PARTITION_OVERFLOW);
            uVar9 = (ulong)uVar8;
          }
          iVar7 = (int)uVar9;
          if (0xffffff < uVar12) goto LAB_001385f6;
          lVar10 = lVar10 + 1;
          puVar13 = puVar13 + 3;
          psVar18 = psVar18 + 6;
        } while (lVar10 < (long)enc->num_parts_ + -1);
      }
      iVar7 = 1;
      if ((int)lVar10 != 0) {
        iVar6 = (*pic->writer)(&local_68,(ulong)(uint)((int)lVar10 * 3),pic);
        iVar7 = 1;
        if (iVar6 == 0) {
          iVar7 = WebPEncodingSetError(pic,VP8_ENC_ERROR_BAD_WRITE);
        }
      }
LAB_001385f6:
      bVar20 = iVar7 != 0;
      goto LAB_001385fd;
    }
  }
  bVar20 = false;
LAB_001385fd:
  percent_store = &enc->percent_;
  VP8BitWriterWipeOut(pVVar17);
  if (0 < enc->num_parts_) {
    pVVar17 = enc->parts_;
    lVar10 = 0;
    do {
      if (pVVar17->pos_ != 0) {
        if (bVar20) {
          iVar7 = (*pic->writer)(pVVar17->buf_,pVVar17->pos_,pic);
          bVar20 = iVar7 != 0;
        }
        else {
          bVar20 = false;
        }
      }
      VP8BitWriterWipeOut(pVVar17);
      if (bVar20) {
        iVar7 = WebPReportProgress(pic,*percent_store + local_44,percent_store);
        bVar20 = iVar7 != 0;
      }
      else {
        bVar20 = false;
      }
      lVar10 = lVar10 + 1;
      pVVar17 = pVVar17 + 1;
    } while (lVar10 < enc->num_parts_);
  }
  if ((bVar20) && (local_70 != 0)) {
    local_68 = '\0';
    iVar7 = (*pic->writer)(&local_68,1,pic);
    bVar20 = iVar7 != 0;
  }
  enc->coded_size_ = (int)local_50 + 8;
  if (bVar20) {
    iVar7 = WebPReportProgress(pic,local_48 + 0x13,percent_store);
    bVar20 = iVar7 != 0;
  }
  else {
    bVar20 = false;
  }
  if (bVar20 == false) {
    WebPEncodingSetError(pic,VP8_ENC_ERROR_BAD_WRITE);
  }
  return (uint)bVar20;
}

Assistant:

int VP8EncWrite(VP8Encoder* const enc) {
  WebPPicture* const pic = enc->pic_;
  VP8BitWriter* const bw = &enc->bw_;
  const int task_percent = 19;
  const int percent_per_part = task_percent / enc->num_parts_;
  const int final_percent = enc->percent_ + task_percent;
  int ok = 0;
  size_t vp8_size, pad, riff_size;
  int p;

  // Partition #0 with header and partition sizes
  ok = GeneratePartition0(enc);
  if (!ok) return 0;

  // Compute VP8 size
  vp8_size = VP8_FRAME_HEADER_SIZE +
             VP8BitWriterSize(bw) +
             3 * (enc->num_parts_ - 1);
  for (p = 0; p < enc->num_parts_; ++p) {
    vp8_size += VP8BitWriterSize(enc->parts_ + p);
  }
  pad = vp8_size & 1;
  vp8_size += pad;

  // Compute RIFF size
  // At the minimum it is: "WEBPVP8 nnnn" + VP8 data size.
  riff_size = TAG_SIZE + CHUNK_HEADER_SIZE + vp8_size;
  if (IsVP8XNeeded(enc)) {  // Add size for: VP8X header + data.
    riff_size += CHUNK_HEADER_SIZE + VP8X_CHUNK_SIZE;
  }
  if (enc->has_alpha_) {  // Add size for: ALPH header + data.
    const uint32_t padded_alpha_size = enc->alpha_data_size_ +
                                       (enc->alpha_data_size_ & 1);
    riff_size += CHUNK_HEADER_SIZE + padded_alpha_size;
  }
  // RIFF size should fit in 32-bits.
  if (riff_size > 0xfffffffeU) {
    return WebPEncodingSetError(pic, VP8_ENC_ERROR_FILE_TOO_BIG);
  }

  // Emit headers and partition #0
  {
    const uint8_t* const part0 = VP8BitWriterBuf(bw);
    const size_t size0 = VP8BitWriterSize(bw);
    ok = ok && PutWebPHeaders(enc, size0, vp8_size, riff_size)
            && pic->writer(part0, size0, pic)
            && EmitPartitionsSize(enc, pic);
    VP8BitWriterWipeOut(bw);    // will free the internal buffer.
  }

  // Token partitions
  for (p = 0; p < enc->num_parts_; ++p) {
    const uint8_t* const buf = VP8BitWriterBuf(enc->parts_ + p);
    const size_t size = VP8BitWriterSize(enc->parts_ + p);
    if (size) ok = ok && pic->writer(buf, size, pic);
    VP8BitWriterWipeOut(enc->parts_ + p);    // will free the internal buffer.
    ok = ok && WebPReportProgress(pic, enc->percent_ + percent_per_part,
                                  &enc->percent_);
  }

  // Padding byte
  if (ok && pad) {
    ok = PutPaddingByte(pic);
  }

  enc->coded_size_ = (int)(CHUNK_HEADER_SIZE + riff_size);
  ok = ok && WebPReportProgress(pic, final_percent, &enc->percent_);
  if (!ok) WebPEncodingSetError(pic, VP8_ENC_ERROR_BAD_WRITE);
  return ok;
}